

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::logSubmit
          (BufferCopyFromBuffer *this,TestLog *log,size_t commandIndex)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  undefined1 local_198 [384];
  char *__s;
  
  this_00 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,":",1);
  iVar1 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
  __s = (char *)CONCAT44(extraout_var,iVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_198._8_8_ + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," Copy buffer data from another buffer",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  return;
}

Assistant:

void BufferCopyFromBuffer::logSubmit (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName() << " Copy buffer data from another buffer" << TestLog::EndMessage;
}